

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::CFIReaderImpl::~CFIReaderImpl(CFIReaderImpl *this)

{
  ~CFIReaderImpl(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~CFIReaderImpl() {}